

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall HFFilteredConsumer::~HFFilteredConsumer(HFFilteredConsumer *this)

{
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__HFFilteredConsumer_002fa368;
  if (this->input != (byte *)0x0) {
    operator_delete__(this->input);
  }
  HFParsingInfo::~HFParsingInfo(&this->args);
  HFSubConsumer::~HFSubConsumer(&this->super_HFSubConsumer);
  return;
}

Assistant:

HFFilteredConsumer::~HFFilteredConsumer(){
    delete [] input;
}